

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

int Maj3_ManAddCnfStart(Maj3_Man_t *p)

{
  int iVar1;
  int local_b0;
  int local_ac;
  int Count_1;
  int Count;
  int pLits [32];
  int local_20;
  int nLits;
  int status;
  int k;
  int i;
  Maj3_Man_t *p_local;
  
  status = p->nVars;
  do {
    if (p->nObjs <= status) {
      nLits = 0;
      while( true ) {
        if (p->nObjs + -1 <= nLits) {
          iVar1 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
          if (iVar1 != 1) {
            __assert_fail("status == GLUCOSE_SAT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                          ,0x13f,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
          }
          Maj3_ManVarMapPrint(p);
          return 1;
        }
        local_b0 = 0;
        for (status = 0; status < p->nObjs; status = status + 1) {
          local_b0 = (uint)(p->VarMarks[status][nLits] == 1) + local_b0;
        }
        if (3 < local_b0) break;
        if (local_b0 < 1) {
          local_20 = 0;
          for (status = 0; status < p->nObjs; status = status + 1) {
            if (1 < p->VarMarks[status][nLits]) {
              iVar1 = Abc_Var2Lit(p->VarMarks[status][nLits],0);
              (&Count_1)[local_20] = iVar1;
              local_20 = local_20 + 1;
            }
          }
          if ((0 < local_20) &&
             (iVar1 = bmcg_sat_solver_addclause(p->pSat,&Count_1,local_20), iVar1 == 0)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                          ,0x13c,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
          }
        }
        nLits = nLits + 1;
      }
      __assert_fail("Count <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                    ,0x131,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
    }
    local_ac = 0;
    for (nLits = 0; nLits < p->nObjs; nLits = nLits + 1) {
      local_ac = (uint)(p->VarMarks[status][nLits] == 1) + local_ac;
    }
    if (3 < local_ac) {
      __assert_fail("Count <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                    ,0x11c,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
    }
    if (local_ac != 3) {
      local_20 = 0;
      for (nLits = 0; nLits < p->nObjs; nLits = nLits + 1) {
        if (1 < p->VarMarks[status][nLits]) {
          iVar1 = Abc_Var2Lit(p->VarMarks[status][nLits],0);
          (&Count_1)[local_20] = iVar1;
          local_20 = local_20 + 1;
        }
      }
      if (local_20 < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0x125,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
      }
      if ((0 < local_20) &&
         (iVar1 = bmcg_sat_solver_addclause(p->pSat,&Count_1,local_20), iVar1 == 0)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0x127,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
      }
    }
    status = status + 1;
  } while( true );
}

Assistant:

int Maj3_ManAddCnfStart( Maj3_Man_t * p )
{
    int i, k, status, nLits, pLits[MAJ3_OBJS];
    // nodes have at least one fanin
    //printf( "Fanin clauses:\n" );
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        // check if it is already connected
        int Count = 0;
        for ( k = 0; k < p->nObjs; k++ ) 
            Count += p->VarMarks[i][k] == 1;
        assert( Count <= 3 );
        if ( Count == 3 )
            continue;
        // collect connections
        nLits = 0;
        for ( k = 0; k < p->nObjs; k++ ) 
            if ( p->VarMarks[i][k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k], 0 );
        //Maj3_PrintClause( pLits, nLits );
        assert( nLits > 0 );
        if ( nLits > 0 && !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            assert(0);
    }
    // nodes have at least one fanout
    //printf( "Fanout clauses:\n" );
    for ( k = 0; k < p->nObjs-1; k++ )
    {
        // check if it is already connected
        int Count = 0;
        for ( i = 0; i < p->nObjs; i++ ) 
            Count += p->VarMarks[i][k] == 1;
        assert( Count <= 3 );
        if ( Count > 0 )
            continue;
        // collect connections
        nLits = 0;
        for ( i = 0; i < p->nObjs; i++ ) 
            if ( p->VarMarks[i][k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k], 0 );
        //Maj3_PrintClause( pLits, nLits );
        //assert( nLits > 0 );
        if ( nLits > 0 && !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            assert(0);
    }
    status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
    assert( status == GLUCOSE_SAT );
    Maj3_ManVarMapPrint( p );
    return 1;
}